

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<int,ft::allocator<int>>::assign<ft::constListIterator<int>>
          (list<int,ft::allocator<int>> *this,constListIterator<int> *first,
          constListIterator<int> *last,type *param_3)

{
  Node *val;
  
  list<int,_ft::allocator<int>_>::clear((list<int,_ft::allocator<int>_> *)this);
  val = (first->super_listIterator<int>).m_node;
  while (val != (last->super_listIterator<int>).m_node) {
    list<int,_ft::allocator<int>_>::push_back((list<int,_ft::allocator<int>_> *)this,&val->data);
    val = ((first->super_listIterator<int>).m_node)->next;
    (first->super_listIterator<int>).m_node = val;
  }
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();
		while (first != last) {
			this->push_back(*first);
			++first;
		}
	}